

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

bool isItAFunction<KarpRabinHash<unsigned_int,unsigned_char>>(uint L)

{
  iterator *this;
  uchar outchar;
  uint uVar1;
  uint32_conflict uVar2;
  uint uVar3;
  ostream *poVar4;
  reference puVar5;
  uint uVar6;
  uchar inchar;
  int iVar7;
  _Elt_pointer puVar8;
  _Elt_pointer puVar9;
  uint j;
  long __n;
  bool bVar10;
  uchar c;
  _Map_pointer local_1838;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  KarpRabinHash<unsigned_int,_unsigned_char> hf;
  mersenneRNG generator;
  
  MTRand::seed(&generator.mtr);
  generator.n = 5;
  iVar7 = 3;
  KarpRabinHash<unsigned_int,_unsigned_char>::KarpRabinHash(&hf,3,L);
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_Deque_base
            (&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
  while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
    uVar2 = mersenneRNG::operator()(&generator);
    c = (char)uVar2 + 'A';
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)
               &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>,&c);
    hf.hashvalue = hf.hashvalue * 0x25 + hf.hasher.hashvalues[c] & hf.HASHMASK;
  }
  this = &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Deque_impl_data._M_start;
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (uVar6 == 100000) goto LAB_00102f16;
    outchar = *s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&s);
    uVar2 = mersenneRNG::operator()(&generator);
    inchar = (char)uVar2 + 'A';
    c = inchar;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>(&s,&c);
    KarpRabinHash<unsigned_int,_unsigned_char>::update(&hf,outchar,inchar);
    uVar3 = KarpRabinHash<unsigned_int,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((KarpRabinHash<unsigned_int,unsigned_char> *)&hf,&s);
    uVar1 = uVar6 + 1;
  } while (uVar3 == hf.hashvalue);
  local_1838 = s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
  puVar8 = s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  puVar9 = s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  while (puVar9 != s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur) {
    poVar4 = std::operator<<((ostream *)&std::cout,*puVar9);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    puVar9 = puVar9 + 1;
    if (puVar9 == puVar8) {
      puVar9 = local_1838[1];
      local_1838 = local_1838 + 1;
      puVar8 = puVar9 + 0x200;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"bug");
  std::endl<char,std::char_traits<char>>(poVar4);
  puVar5 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[](this,0)
  ;
  poVar4 = std::operator<<((ostream *)&std::cerr,*puVar5);
  puVar5 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[](this,1)
  ;
  poVar4 = std::operator<<(poVar4,*puVar5);
  puVar5 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[](this,2)
  ;
  poVar4 = std::operator<<(poVar4,*puVar5);
  poVar4 = std::operator<<(poVar4," was hashed to ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," when true hash value is ");
  KarpRabinHash<unsigned_int,unsigned_char>::
  hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
            ((KarpRabinHash<unsigned_int,unsigned_char> *)&hf,&s);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  for (__n = 0; __n != 3; __n = __n + 1) {
    puVar5 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[]
                       (this,__n);
    poVar4 = std::operator<<((ostream *)&std::cerr,*puVar5);
    poVar4 = std::operator<<(poVar4,"->");
    std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[](this,__n);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
LAB_00102f16:
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
            (&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return 99999 < uVar6;
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}